

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O3

string * __thiscall
spvtools::opt::Operand::AsString_abi_cxx11_(string *__return_storage_ptr__,Operand *this)

{
  uint uVar1;
  uint **ppuVar2;
  uint **ppuVar3;
  uint *puVar4;
  long lVar5;
  uint *pos;
  uint *puVar6;
  
  if (this->type != SPV_OPERAND_TYPE_LITERAL_STRING) {
    __assert_fail("type == SPV_OPERAND_TYPE_LITERAL_STRING",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                  ,0x67,"std::string spvtools::opt::Operand::AsString() const");
  }
  ppuVar2 = (uint **)(this->words).large_data_._M_t.
                     super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                     ._M_head_impl;
  ppuVar3 = &(this->words).small_data_;
  if (ppuVar2 != (uint **)0x0) {
    ppuVar3 = ppuVar2;
  }
  puVar6 = *ppuVar3;
  if (ppuVar2 == (uint **)0x0) {
    puVar4 = (this->words).small_data_ + (this->words).size_;
  }
  else {
    puVar4 = *(uint **)&((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)(ppuVar2 + 1))
                        ->_M_impl;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  do {
    if (puVar6 == puVar4) {
      __assert_fail("!assert_found_terminating_null && \"Did not find terminating null for the string.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/string_utils.h"
                    ,0x65,
                    "std::string spvtools::utils::MakeString(InputIt, InputIt, bool) [InputIt = const unsigned int *]"
                   );
    }
    uVar1 = *puVar6;
    lVar5 = 0;
    do {
      if ((char)(uVar1 >> ((byte)lVar5 & 0x1f)) == '\0') {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x20);
    puVar6 = puVar6 + 1;
  } while( true );
}

Assistant:

std::string AsString() const {
    assert(type == SPV_OPERAND_TYPE_LITERAL_STRING);
    return spvtools::utils::MakeString(words);
  }